

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regexp.cpp
# Opt level: O2

void __thiscall mjs::regexp::~regexp(regexp *this)

{
  std::__cxx11::wstring::~wstring((wstring *)&this->pattern_);
  std::unique_ptr<mjs::regexp::impl,_std::default_delete<mjs::regexp::impl>_>::~unique_ptr
            (&this->impl_);
  return;
}

Assistant:

regexp::~regexp() = default;